

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

void basic_publish(amqp_connection_state_t connectionState_,char *message_)

{
  int iVar1;
  amqp_channel_t in_stack_00000056;
  amqp_connection_state_t in_stack_00000058;
  int retval;
  amqp_basic_properties_t properties;
  amqp_bytes_t message_bytes;
  
  amqp_cstring_bytes((char *)0x1024f4);
  amqp_cstring_bytes((char *)0x10253a);
  amqp_cstring_bytes((char *)0x102550);
  iVar1 = amqp_basic_publish(in_stack_00000058,in_stack_00000056,(amqp_bytes_t)properties._16_16_,
                             (amqp_bytes_t)properties._0_16_,
                             (amqp_boolean_t)properties.headers.entries,properties._56_4_,
                             (amqp_basic_properties_t *)properties.correlation_id.len,
                             (amqp_bytes_t)properties._72_16_);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("retval == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x4b,"void basic_publish(amqp_connection_state_t, const char *)");
}

Assistant:

void basic_publish(amqp_connection_state_t connectionState_,
                   const char *message_) {
  amqp_bytes_t message_bytes = amqp_cstring_bytes(message_);

  amqp_basic_properties_t properties;
  properties._flags = 0;

  properties._flags |= AMQP_BASIC_DELIVERY_MODE_FLAG;
  properties.delivery_mode = AMQP_DELIVERY_NONPERSISTENT;

  int retval = amqp_basic_publish(
      connectionState_, fixed_channel_id, amqp_cstring_bytes(""),
      amqp_cstring_bytes(test_queue_name),
      /* mandatory=*/1,
      /* immediate=*/0, /* RabbitMQ 3.x does not support the "immediate" flag
                          according to
                          https://www.rabbitmq.com/specification.html */
      &properties, message_bytes);

  assert(retval == 0);
}